

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_>::freeData
          (Span<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *this)

{
  Entry *pEVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->entries != (Entry *)0x0) {
    lVar3 = 0;
    do {
      uVar2 = (ulong)this->offsets[lVar3];
      if (uVar2 != 0xff) {
        pEVar1 = this->entries;
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash
                  ((QMultiHash<QString,_QCss::StyleRule> *)(pEVar1[uVar2].storage.data + 0x98));
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash
                  ((QMultiHash<QString,_QCss::StyleRule> *)(pEVar1[uVar2].storage.data + 0x88));
        QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::ImportRule> *)(pEVar1[uVar2].storage.data + 0x68));
        QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::AnimationRule> *)(pEVar1[uVar2].storage.data + 0x50));
        QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::PageRule> *)(pEVar1[uVar2].storage.data + 0x38));
        QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::MediaRule> *)(pEVar1[uVar2].storage.data + 0x20));
        QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::StyleRule> *)(pEVar1[uVar2].storage.data + 8));
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }